

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_157::TranslateToExnref::doWalkFunction(TranslateToExnref *this,Function *func)

{
  _Base_ptr p_Var1;
  size_type *psVar2;
  __node_base *p_Var3;
  _Base_ptr *pp_Var4;
  pointer *this_00;
  char cVar5;
  Expression **ppEVar6;
  void *pvVar7;
  __node_base_ptr p_Var8;
  pointer puVar9;
  pointer puVar10;
  pointer pcVar11;
  optional<wasm::Type> type;
  Module *pMVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  unordered_map<wasm::Name,_wasm::DataSegment_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DataSegment_*>_>_>
  *puVar20;
  __node_base_ptr *pp_Var21;
  mapped_type *pmVar22;
  _Rb_tree_node_base *p_Var23;
  __node_base_ptr p_Var24;
  Expression *any;
  Expression *append;
  Block *pBVar25;
  ThrowRef *this_01;
  char *pcVar26;
  pointer pTVar27;
  Builder BVar28;
  string_view sVar29;
  Signature SVar30;
  string local_1b8;
  LabelManager *local_198;
  _Rb_tree_node_base *local_190;
  undefined1 local_188 [224];
  _Rb_tree_node_base _Stack_a8;
  undefined1 local_88 [24];
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined1 auStack_60 [24];
  _Base_ptr local_48;
  Builder local_40;
  Builder builder;
  
  LabelUtils::LabelManager::LabelManager((LabelManager *)local_188,func);
  local_88[0x10] = 1;
  local_198 = (LabelManager *)&this->labels;
  std::_Optional_payload_base<wasm::LabelUtils::LabelManager>::_M_move_assign
            ((_Optional_payload_base<wasm::LabelUtils::LabelManager> *)local_198,
             (_Optional_payload_base<wasm::LabelUtils::LabelManager> *)local_188);
  if ((bool)local_88[0x10] == true) {
    std::_Optional_payload_base<wasm::LabelUtils::LabelManager>::_M_destroy
              ((_Optional_payload_base<wasm::LabelUtils::LabelManager> *)local_188);
  }
  _Stack_a8._M_left = &_Stack_a8;
  local_188._0_8_ = (Expression **)0x0;
  local_188._8_8_ = (_Hash_node_base *)0x0;
  local_188._192_8_ = (pointer)0x0;
  local_188._176_8_ = (pointer)0x0;
  local_188._184_8_ = (pointer)0x0;
  local_188._208_8_ = (Module *)0x0;
  _Stack_a8._0_8_ = (ulong)(uint)_Stack_a8._4_4_ << 0x20;
  _Stack_a8._M_parent = (_Base_ptr)0x0;
  local_88._0_8_ = (__buckets_ptr)0x0;
  p_Var1 = (_Base_ptr)(local_88 + 0x10);
  local_88._16_8_ = local_88._16_8_ & 0xffffffff00000000;
  _local_70 = (_Base_ptr)0x0;
  auStack_60._8_8_ = (__node_base_ptr)0x0;
  local_48 = (_Base_ptr)&func->body;
  local_188._200_8_ = func;
  _Stack_a8._M_right = _Stack_a8._M_left;
  local_68 = p_Var1;
  auStack_60._0_8_ = p_Var1;
  builder.wasm = (Module *)this;
  Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
              *)local_188,
             PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
             ::scan,(Expression **)local_48);
  if (((long)(local_188._184_8_ - local_188._176_8_) >> 4) + local_188._8_8_ != 0) {
    do {
      if (local_188._176_8_ == local_188._184_8_) {
        if ((_Hash_node_base *)local_188._8_8_ == (_Hash_node_base *)0x0) {
          pcVar26 = 
          "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>>::Task, N = 10]"
          ;
          goto LAB_00b6f0f8;
        }
        pTVar27 = (pointer)(local_188 + local_188._8_8_ * 0x10);
      }
      else {
        pTVar27 = (pointer)(local_188._184_8_ + -0x10);
      }
      ppEVar6 = pTVar27->currp;
      if (local_188._176_8_ == local_188._184_8_) {
        if ((_Hash_node_base *)local_188._8_8_ == (_Hash_node_base *)0x0) {
          pcVar26 = 
          "void wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>>::Task, 10>::pop_back() [T = wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>>::Task, N = 10]"
          ;
          goto LAB_00b6f0d9;
        }
        local_188._8_8_ = local_188._8_8_ - 1;
      }
      else {
        local_188._184_8_ = local_188._184_8_ + -0x10;
      }
      local_188._0_8_ = ppEVar6;
      if (*ppEVar6 == (Expression *)0x0) {
        pcVar26 = 
        "void wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>]"
        ;
        goto LAB_00b6f08c;
      }
      (*(code *)(((__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true> *)
                 &pTVar27->func)->super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)
                ._M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl)(local_188);
    } while (((long)(local_188._184_8_ - local_188._176_8_) >> 4) + local_188._8_8_ != 0);
  }
  BVar28.wasm = builder.wasm;
  local_188._200_8_ = (Function *)0x0;
  auStack_60[0x10] = true;
  cVar5 = *(char *)&((builder.wasm)->globalsMap)._M_h._M_buckets;
  ((builder.wasm)->exportsMap)._M_h._M_element_count = local_188._0_8_;
  *(undefined8 *)&((builder.wasm)->exportsMap)._M_h._M_rehash_policy = local_188._8_8_;
  if (cVar5 == '\x01') {
    memcpy(&((builder.wasm)->exportsMap)._M_h._M_rehash_policy._M_next_resize,local_188 + 0x10,0xa0)
    ;
    pvVar7 = *(void **)&((BVar28.wasm)->memoriesMap)._M_h._M_rehash_policy;
    p_Var8 = ((BVar28.wasm)->memoriesMap)._M_h._M_single_bucket;
    *(undefined8 *)&((BVar28.wasm)->memoriesMap)._M_h._M_rehash_policy = local_188._176_8_;
    ((BVar28.wasm)->memoriesMap)._M_h._M_rehash_policy._M_next_resize = local_188._184_8_;
    ((BVar28.wasm)->memoriesMap)._M_h._M_single_bucket = (__node_base_ptr)local_188._192_8_;
    local_188._176_8_ = (pointer)0x0;
    local_188._184_8_ = (pointer)0x0;
    local_188._192_8_ = (pointer)0x0;
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,(long)p_Var8 - (long)pvVar7);
    }
    ((BVar28.wasm)->elementSegmentsMap)._M_h._M_buckets = (__buckets_ptr)local_188._200_8_;
    ((BVar28.wasm)->elementSegmentsMap)._M_h._M_bucket_count = local_188._208_8_;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::clear((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
             *)&((BVar28.wasm)->elementSegmentsMap)._M_h._M_before_begin);
    if (_Stack_a8._M_parent != (_Base_ptr)0x0) {
      *(_Rb_tree_color *)&((BVar28.wasm)->elementSegmentsMap)._M_h._M_element_count =
           _Stack_a8._M_color;
      *(_Base_ptr *)&((BVar28.wasm)->elementSegmentsMap)._M_h._M_rehash_policy = _Stack_a8._M_parent
      ;
      ((BVar28.wasm)->elementSegmentsMap)._M_h._M_rehash_policy._M_next_resize =
           (size_t)_Stack_a8._M_left;
      ((BVar28.wasm)->elementSegmentsMap)._M_h._M_single_bucket =
           (__node_base_ptr)_Stack_a8._M_right;
      *(size_type **)((long)_Stack_a8._M_parent + 8) =
           &((BVar28.wasm)->elementSegmentsMap)._M_h._M_element_count;
      ((BVar28.wasm)->dataSegmentsMap)._M_h._M_buckets = (__buckets_ptr)local_88._0_8_;
      _Stack_a8._M_parent = (_Base_ptr)0x0;
      _Stack_a8._M_left = &_Stack_a8;
      local_88._0_8_ = (__buckets_ptr)0x0;
      _Stack_a8._M_right = _Stack_a8._M_left;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::clear((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
             *)&((BVar28.wasm)->dataSegmentsMap)._M_h._M_bucket_count);
    if ((_Base_ptr)_local_70 != (_Base_ptr)0x0) {
      *(undefined4 *)&((BVar28.wasm)->dataSegmentsMap)._M_h._M_before_begin._M_nxt = local_88._16_4_
      ;
      ((BVar28.wasm)->dataSegmentsMap)._M_h._M_element_count = _local_70;
      *(undefined8 *)&((BVar28.wasm)->dataSegmentsMap)._M_h._M_rehash_policy = local_68;
      ((BVar28.wasm)->dataSegmentsMap)._M_h._M_rehash_policy._M_next_resize = auStack_60._0_8_;
      *(__node_base **)(_local_70 + 8) = &((BVar28.wasm)->dataSegmentsMap)._M_h._M_before_begin;
      ((BVar28.wasm)->dataSegmentsMap)._M_h._M_single_bucket = (__node_base_ptr)auStack_60._8_8_;
      _local_70 = (_Base_ptr)0x0;
      auStack_60._8_8_ = (__node_base_ptr)0x0;
      local_68 = p_Var1;
      auStack_60._0_8_ = p_Var1;
    }
  }
  else {
    memcpy(&((builder.wasm)->exportsMap)._M_h._M_rehash_policy._M_next_resize,local_188 + 0x10,0xa0)
    ;
    *(undefined8 *)&((BVar28.wasm)->memoriesMap)._M_h._M_rehash_policy = local_188._176_8_;
    ((BVar28.wasm)->memoriesMap)._M_h._M_rehash_policy._M_next_resize = local_188._184_8_;
    ((BVar28.wasm)->memoriesMap)._M_h._M_single_bucket = (__node_base_ptr)local_188._192_8_;
    local_188._176_8_ = (pointer)0x0;
    local_188._184_8_ = (pointer)0x0;
    local_188._192_8_ = (pointer)0x0;
    ((BVar28.wasm)->elementSegmentsMap)._M_h._M_buckets = (__buckets_ptr)local_188._200_8_;
    ((BVar28.wasm)->elementSegmentsMap)._M_h._M_bucket_count = local_188._208_8_;
    psVar2 = &((BVar28.wasm)->elementSegmentsMap)._M_h._M_element_count;
    if (_Stack_a8._M_parent == (_Base_ptr)0x0) {
      *(undefined4 *)&((BVar28.wasm)->elementSegmentsMap)._M_h._M_element_count = 0;
      *(undefined8 *)&((BVar28.wasm)->elementSegmentsMap)._M_h._M_rehash_policy = 0;
      ((BVar28.wasm)->elementSegmentsMap)._M_h._M_rehash_policy._M_next_resize = (size_t)psVar2;
      ((BVar28.wasm)->elementSegmentsMap)._M_h._M_single_bucket = (__node_base_ptr)psVar2;
      puVar20 = &(BVar28.wasm)->dataSegmentsMap;
    }
    else {
      puVar20 = (unordered_map<wasm::Name,_wasm::DataSegment_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DataSegment_*>_>_>
                 *)local_88;
      *(_Rb_tree_color *)&((BVar28.wasm)->elementSegmentsMap)._M_h._M_element_count =
           _Stack_a8._M_color;
      *(_Base_ptr *)&((BVar28.wasm)->elementSegmentsMap)._M_h._M_rehash_policy = _Stack_a8._M_parent
      ;
      ((BVar28.wasm)->elementSegmentsMap)._M_h._M_rehash_policy._M_next_resize =
           (size_t)_Stack_a8._M_left;
      ((BVar28.wasm)->elementSegmentsMap)._M_h._M_single_bucket =
           (__node_base_ptr)_Stack_a8._M_right;
      *(size_type **)((long)_Stack_a8._M_parent + 8) = psVar2;
      ((BVar28.wasm)->dataSegmentsMap)._M_h._M_buckets = (__buckets_ptr)local_88._0_8_;
      _Stack_a8._M_parent = (_Base_ptr)0x0;
      _Stack_a8._M_left = &_Stack_a8;
      _Stack_a8._M_right = _Stack_a8._M_left;
    }
    (puVar20->_M_h)._M_buckets = (__buckets_ptr)0x0;
    p_Var3 = &((BVar28.wasm)->dataSegmentsMap)._M_h._M_before_begin;
    if ((_Base_ptr)_local_70 == (_Base_ptr)0x0) {
      *(undefined4 *)&((BVar28.wasm)->dataSegmentsMap)._M_h._M_before_begin._M_nxt = 0;
      ((BVar28.wasm)->dataSegmentsMap)._M_h._M_element_count = 0;
      *(__node_base **)&((BVar28.wasm)->dataSegmentsMap)._M_h._M_rehash_policy = p_Var3;
      ((BVar28.wasm)->dataSegmentsMap)._M_h._M_rehash_policy._M_next_resize = (size_t)p_Var3;
      pp_Var21 = &((BVar28.wasm)->dataSegmentsMap)._M_h._M_single_bucket;
    }
    else {
      pp_Var21 = (__node_base_ptr *)(auStack_60 + 8);
      *(undefined4 *)&((BVar28.wasm)->dataSegmentsMap)._M_h._M_before_begin._M_nxt = local_88._16_4_
      ;
      ((BVar28.wasm)->dataSegmentsMap)._M_h._M_element_count = _local_70;
      *(undefined8 *)&((BVar28.wasm)->dataSegmentsMap)._M_h._M_rehash_policy = local_68;
      ((BVar28.wasm)->dataSegmentsMap)._M_h._M_rehash_policy._M_next_resize = auStack_60._0_8_;
      *(__node_base **)(_local_70 + 8) = p_Var3;
      ((BVar28.wasm)->dataSegmentsMap)._M_h._M_single_bucket = (__node_base_ptr)auStack_60._8_8_;
      _local_70 = (_Base_ptr)0x0;
      local_68 = p_Var1;
      auStack_60._0_8_ = p_Var1;
    }
    *pp_Var21 = (__node_base_ptr)0x0;
    *(undefined1 *)&((BVar28.wasm)->globalsMap)._M_h._M_buckets = 1;
  }
  std::_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
  ::_M_reset((_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
              *)local_188);
  if (*(char *)&((BVar28.wasm)->globalsMap)._M_h._M_buckets == '\0') {
    std::__throw_bad_optional_access();
  }
  local_188._216_8_ = &((BVar28.wasm)->exportsMap)._M_h._M_element_count;
  _Stack_a8._M_right = (_Base_ptr)auStack_60;
  local_188._0_8_ = (Expression **)0x0;
  local_188._8_8_ = (_Hash_node_base *)0x0;
  local_188._192_8_ = (pointer)0x0;
  local_188._176_8_ = (pointer)0x0;
  local_188._184_8_ = (pointer)0x0;
  local_188._208_8_ = (Module *)0x0;
  _Stack_a8._0_8_ = (pointer)0x0;
  _Stack_a8._M_parent = (_Base_ptr)0x0;
  _Stack_a8._M_left = (_Rb_tree_node_base *)0x0;
  local_88._0_8_ = (__buckets_ptr)0x1;
  local_88._8_8_ = (_Hash_node_base *)0x0;
  local_88._16_8_ = (_Hash_node_base *)0x0;
  local_70 = 0x3f800000;
  local_68 = (_Base_ptr)0x0;
  auStack_60._0_8_ = (_Base_ptr)0x0;
  auStack_60._8_8_ = (__node_base_ptr)0x0;
  pp_Var4 = &_Stack_a8._M_right;
  local_188._200_8_ = func;
  Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
              *)local_188,ExnrefLocalAssigner::scan,(Expression **)local_48);
  if (((long)(local_188._184_8_ - local_188._176_8_) >> 4) + local_188._8_8_ != 0) {
    do {
      pTVar27 = (pointer)local_188._184_8_;
      if (local_188._176_8_ == local_188._184_8_) {
        if ((_Hash_node_base *)local_188._8_8_ == (_Hash_node_base *)0x0) {
          pcVar26 = 
          "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>>::Task, N = 10]"
          ;
LAB_00b6f0f8:
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,pcVar26);
        }
        pTVar27 = (pointer)(local_188 + local_188._8_8_ * 0x10 + 0x10);
      }
      ppEVar6 = pTVar27[-1].currp;
      if (local_188._176_8_ == local_188._184_8_) {
        if ((_Hash_node_base *)local_188._8_8_ == (_Hash_node_base *)0x0) {
          pcVar26 = 
          "void wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>>::Task, 10>::pop_back() [T = wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>>::Task, N = 10]"
          ;
LAB_00b6f0d9:
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x75,pcVar26);
        }
        local_188._8_8_ = local_188._8_8_ - 1;
      }
      else {
        local_188._184_8_ = local_188._184_8_ + -0x10;
      }
      local_188._0_8_ = ppEVar6;
      if (*ppEVar6 == (Expression *)0x0) {
        pcVar26 = 
        "void wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>]"
        ;
LAB_00b6f08c:
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,pcVar26);
      }
      (*(code *)(((__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true> *)
                 &pTVar27[-1].func)->
                super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)._M_t.
                super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl)(local_188);
    } while (((long)(local_188._184_8_ - local_188._176_8_) >> 4) + local_188._8_8_ != 0);
  }
  BVar28.wasm = builder.wasm;
  local_188._200_8_ = (Function *)0x0;
  auStack_60[0x10] = true;
  cVar5 = *(char *)&builder.wasm[1].customSections.
                    super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  ((builder.wasm)->globalsMap)._M_h._M_bucket_count = local_188._0_8_;
  ((builder.wasm)->globalsMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_188._8_8_;
  if (cVar5 == '\x01') {
    memcpy(&((builder.wasm)->globalsMap)._M_h._M_element_count,local_188 + 0x10,0xa0);
    puVar9 = BVar28.wasm[1].tags.
             super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar10 = BVar28.wasm[1].tags.
              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    BVar28.wasm[1].tags.
    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_188._176_8_;
    BVar28.wasm[1].tags.
    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_188._184_8_;
    BVar28.wasm[1].tags.
    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_188._192_8_;
    local_188._176_8_ = (pointer)0x0;
    local_188._184_8_ = (pointer)0x0;
    local_188._192_8_ = (pointer)0x0;
    if (puVar9 != (pointer)0x0) {
      operator_delete(puVar9,(long)puVar10 - (long)puVar9);
    }
    *(undefined4 *)
     &BVar28.wasm[1].elementSegments.
      super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_188._200_4_;
    *(undefined4 *)
     ((long)&BVar28.wasm[1].elementSegments.
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = local_188._204_4_;
    *(undefined4 *)
     &BVar28.wasm[1].elementSegments.
      super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_188._208_4_;
    *(undefined4 *)
     ((long)&BVar28.wasm[1].elementSegments.
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = local_188._212_4_;
    BVar28.wasm[1].elementSegments.
    super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_188._216_8_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&BVar28.wasm[1].memories,
               &_Stack_a8);
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&BVar28.wasm[1].dataSegments,pp_Var4);
    BVar28.wasm[1].start.super_IString.str._M_str = (char *)auStack_60._8_8_;
  }
  else {
    memcpy(&((builder.wasm)->globalsMap)._M_h._M_element_count,local_188 + 0x10,0xa0);
    builder.wasm[1].tags.
    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_188._176_8_;
    builder.wasm[1].tags.
    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_188._184_8_;
    builder.wasm[1].tags.
    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_188._192_8_;
    local_188._192_8_ = (pointer)0x0;
    local_188._176_8_ = (pointer)0x0;
    local_188._184_8_ = (pointer)0x0;
    builder.wasm[1].elementSegments.
    super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_188._200_8_;
    builder.wasm[1].elementSegments.
    super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_188._208_8_;
    builder.wasm[1].elementSegments.
    super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_188._216_8_;
    builder.wasm[1].memories.
    super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)_Stack_a8._0_8_;
    *(undefined4 *)
     &builder.wasm[1].memories.
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = _Stack_a8._M_parent._0_4_;
    *(undefined4 *)
     ((long)&builder.wasm[1].memories.
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = _Stack_a8._M_parent._4_4_;
    *(undefined4 *)
     &builder.wasm[1].memories.
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = _Stack_a8._M_left._0_4_;
    *(undefined4 *)
     ((long)&builder.wasm[1].memories.
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = _Stack_a8._M_left._4_4_;
    _Stack_a8._M_left = (_Rb_tree_node_base *)0x0;
    _Stack_a8._0_8_ = (pointer)0x0;
    _Stack_a8._M_parent = (_Base_ptr)0x0;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&builder.wasm[1].dataSegments,pp_Var4,pp_Var4);
    builder.wasm[1].start.super_IString.str._M_str = (char *)auStack_60._8_8_;
    *(undefined1 *)
     &builder.wasm[1].customSections.
      super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
      super__Vector_impl_data._M_start = 1;
    BVar28 = builder;
  }
  std::_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>::
  _M_reset((_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
            *)local_188);
  p_Var23 = (_Rb_tree_node_base *)
            ((BVar28.wasm)->elementSegmentsMap)._M_h._M_rehash_policy._M_next_resize;
  local_190 = (_Rb_tree_node_base *)&((BVar28.wasm)->elementSegmentsMap)._M_h._M_element_count;
  if (p_Var23 != local_190) {
    pMVar12 = builder.wasm + 1;
    do {
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,p_Var23[1]._M_parent,
                 (long)&(p_Var23[1]._M_parent)->_M_color + *(long *)(p_Var23 + 1));
      sVar29 = (string_view)LabelUtils::LabelManager::getUnique(local_198,&local_1b8);
      pmVar22 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&(pMVar12->customSections).
                                 super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                             (key_type *)(p_Var23 + 1));
      (pmVar22->super_IString).str = sVar29;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
    } while (p_Var23 != local_190);
  }
  BVar28.wasm = builder.wasm;
  Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
  ::walk((Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
          *)&((builder.wasm)->tags).
             super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,(Expression **)local_48);
  this_00 = &BVar28.wasm[1].customSections.
             super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
             super__Vector_impl_data._M_finish;
  p_Var24 = std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_M_find_before_node
                      ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)this_00,
                       DAT_010d2868 %
                       (ulong)BVar28.wasm[1].customSections.
                              super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (key_type *)&DELEGATE_CALLER_TARGET,DAT_010d2868);
  if ((p_Var24 != (__node_base_ptr)0x0) && (p_Var24->_M_nxt != (_Hash_node_base *)0x0)) {
    pmVar22 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,(key_type *)&DELEGATE_CALLER_TARGET);
    sVar29 = (pmVar22->super_IString).str;
    local_40.wasm = (Module *)((BVar28.wasm)->debugInfoSourceRoot)._M_string_length;
    pcVar11 = ((BVar28.wasm)->debugInfoSourceRoot)._M_dataplus._M_p;
    SVar30 = HeapType::getSignature((HeapType *)(pcVar11 + 0x38));
    if (SVar30.results.id.id < 2) {
      append = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
      append->_id = ReturnId;
      (append->type).id = 0;
      *(undefined8 *)(append + 1) = 0;
      (append->type).id = 1;
      *(undefined8 *)(append + 1) = 0;
      any = *(Expression **)(pcVar11 + 0x60);
    }
    else {
      cVar5 = pcVar11[0x60];
      cVar13 = pcVar11[0x61];
      cVar14 = pcVar11[0x62];
      cVar15 = pcVar11[99];
      cVar16 = pcVar11[100];
      cVar17 = pcVar11[0x65];
      cVar18 = pcVar11[0x66];
      cVar19 = pcVar11[0x67];
      any = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
      any->_id = ReturnId;
      (any->type).id = 0;
      *(undefined8 *)(any + 1) = 0;
      (any->type).id = 1;
      any[1]._id = cVar5;
      any[1].field_0x1 = cVar13;
      any[1].field_0x2 = cVar14;
      any[1].field_0x3 = cVar15;
      any[1].field_0x4 = cVar16;
      any[1].field_0x5 = cVar17;
      any[1].field_0x6 = cVar18;
      any[1].field_0x7 = cVar19;
      append = (Expression *)0x0;
    }
    local_188[8] = 1;
    local_188._0_8_ = (Expression **)0x4a;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = local_188._8_8_;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)0x4a;
    pBVar25 = Builder::blockifyWithName(&local_40,any,(Name)sVar29,append,type);
    this_01 = (ThrowRef *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression._id = ThrowRefId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id = 0;
    this_01->exnref = (Expression *)pBVar25;
    ThrowRef::finalize(this_01);
    *(ThrowRef **)(pcVar11 + 0x60) = this_01;
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    labels = std::make_optional<LabelUtils::LabelManager>(func);
    labelScanner = std::make_optional<TargetTryLabelScanner>(func);
    localAssigner =
      std::make_optional<ExnrefLocalAssigner>(func, &labelScanner.value());

    // Create a unique br target label for each existing delegate target label,
    // because we are going to achieve 'delegate's effects with 'br's. See
    // processDelegateTarget() for details.
    for (auto& target : labelScanner->delegateTargets) {
      delegateTargetToTrampoline[target] = labels->getUnique(target.toString());
    }

    Super::doWalkFunction(func);

    // Similar to processDelegateTarget(), but for the caller target.
    if (delegateTargetToTrampoline.find(DELEGATE_CALLER_TARGET) !=
        delegateTargetToTrampoline.end()) {
      processCallerDelegateTarget();
    }
  }